

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O0

LispPTR DSK_deletefile(LispPTR *args)

{
  int iVar1;
  LispPTR *pLVar2;
  ulong uVar3;
  DLword *pDVar4;
  int *piVar5;
  bool bVar6;
  LispPTR local_408c;
  int local_4088;
  ulong local_4080;
  size_t lf_ii;
  size_t lf_i;
  char *lf_dptr;
  char *lf_sptr;
  size_t lf_length;
  short *lf_sbase;
  char *lf_dp;
  char *lf_base;
  OneDArray *lf_arrayp_1;
  OneDArray *lf_arrayp;
  int fatp;
  int rval;
  char ver [16];
  char dir [4096];
  char vless [4096];
  char fbuf [4096];
  char file [4096];
  LispPTR *args_local;
  
  iVar1 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar1 == 0) {
    Lisp_errno = (int *)NativeAligned4FromLAddr(args[1]);
    pLVar2 = NativeAligned4FromLAddr(*args);
    if (*(char *)((long)pLVar2 + 6) == 'C') {
      lf_arrayp._4_4_ = pLVar2[2];
      lf_arrayp._0_4_ = 0;
    }
    else if (*(char *)((long)pLVar2 + 6) == 'D') {
      lf_arrayp._4_4_ = pLVar2[2] << 1;
      lf_arrayp._0_4_ = 1;
    }
    else {
      error("LispStringLength: Not a character array.\n");
    }
    if ((int)lf_arrayp == 0) {
      local_4088 = lf_arrayp._4_4_ + 3;
    }
    else {
      local_4088 = lf_arrayp._4_4_ + 5;
    }
    lf_arrayp._4_4_ = local_4088;
    if (local_4088 < 0x1001) {
      pLVar2 = NativeAligned4FromLAddr(*args);
      if ((int)pLVar2[2] < 0x1000) {
        local_408c = pLVar2[2];
      }
      else {
        local_408c = 0x1000;
      }
      uVar3 = (ulong)(int)local_408c;
      if (*(char *)((long)pLVar2 + 6) == 'C') {
        pDVar4 = NativeAligned2FromLAddr(*pLVar2 & 0xfffffff);
        lf_i = (size_t)(vless + 0xff8);
        lf_dptr = (char *)((long)pDVar4 + (long)(int)(uint)(ushort)pLVar2[1]);
        for (lf_ii = 0; lf_ii < uVar3; lf_ii = lf_ii + 1) {
          *(undefined1 *)lf_i = *(undefined1 *)((ulong)lf_dptr ^ 3);
          lf_i = lf_i + 1;
          lf_dptr = lf_dptr + 1;
        }
        vless[uVar3 + 0xff8] = '\0';
      }
      else if (*(char *)((long)pLVar2 + 6) == 'D') {
        pDVar4 = NativeAligned2FromLAddr(*pLVar2 & 0xfffffff);
        lf_length = (size_t)(pDVar4 + (int)(uint)(ushort)pLVar2[1]);
        lf_sbase = (short *)(vless + 0xff8);
        for (local_4080 = 0; local_4080 < uVar3; local_4080 = local_4080 + 1) {
          *(char *)lf_sbase = (char)*(undefined2 *)(lf_length ^ 2);
          lf_length = lf_length + 2;
          lf_sbase = (short *)((long)lf_sbase + 1);
        }
        *(undefined1 *)lf_sbase = 0;
      }
      else {
        error("LispStringToCString: Not a character array.\n");
      }
      unixpathname(vless + 0xff8,fbuf + 0xff8,1,0);
      iVar1 = unpack_filename(fbuf + 0xff8,ver + 8,vless + 0xff8,(char *)&fatp,1);
      if (iVar1 == 0) {
        args_local._4_4_ = 0;
      }
      else {
        iVar1 = get_version_array(ver + 8,vless + 0xff8);
        if (iVar1 == 0) {
          args_local._4_4_ = 0;
        }
        else if ((VA.files)->version_no == 0xffffffff) {
          args_local._4_4_ = 0;
        }
        else {
          if ((char)fatp == '\0') {
            strcpy(fbuf + 0xff8,vless + 0xff8);
          }
          else {
            strcpy(fbuf + 0xff8,vless + 0xff8);
            strcat(fbuf + 0xff8,".~");
            strcat(fbuf + 0xff8,(char *)&fatp);
            strcat(fbuf + 0xff8,"~");
          }
          iVar1 = get_oldest(ver + 8,VA.files,fbuf + 0xff8,vless + 0xff8);
          if (iVar1 == 0) {
            args_local._4_4_ = 0;
          }
          else {
            iVar1 = get_versionless(VA.files,dir + 0xff8,ver + 8);
            if (iVar1 == 0) {
              alarm(TIMEOUT_TIME);
              do {
                piVar5 = __errno_location();
                *piVar5 = 0;
                lf_arrayp._4_4_ = unlink(fbuf + 0xff8);
                bVar6 = false;
                if (lf_arrayp._4_4_ == -1) {
                  piVar5 = __errno_location();
                  bVar6 = *piVar5 == 4;
                }
              } while (bVar6);
              alarm(0);
              if (lf_arrayp._4_4_ == -1) {
                piVar5 = __errno_location();
                *Lisp_errno = *piVar5;
                args_local._4_4_ = 0;
              }
              else {
                args_local._4_4_ = 0x4c;
              }
            }
            else {
              iVar1 = check_vless_link(dir + 0xff8,VA.files,vless + 0xff8,
                                       (int *)((long)&lf_arrayp + 4));
              if (iVar1 == 0) {
                args_local._4_4_ = 0;
              }
              else {
                iVar1 = strcmp(fbuf + 0xff8,dir + 0xff8);
                if ((iVar1 == 0) || (iVar1 = strcmp(fbuf + 0xff8,vless + 0xff8), iVar1 == 0)) {
                  if (vless[0xff8] == '\0') {
                    alarm(TIMEOUT_TIME);
                    do {
                      piVar5 = __errno_location();
                      *piVar5 = 0;
                      lf_arrayp._4_4_ = unlink(dir + 0xff8);
                      bVar6 = false;
                      if (lf_arrayp._4_4_ == -1) {
                        piVar5 = __errno_location();
                        bVar6 = *piVar5 == 4;
                      }
                    } while (bVar6);
                    alarm(0);
                    if (lf_arrayp._4_4_ == -1) {
                      piVar5 = __errno_location();
                      *Lisp_errno = *piVar5;
                      args_local._4_4_ = 0;
                    }
                    else {
                      args_local._4_4_ = 0x4c;
                    }
                  }
                  else {
                    alarm(TIMEOUT_TIME);
                    do {
                      piVar5 = __errno_location();
                      *piVar5 = 0;
                      lf_arrayp._4_4_ = unlink(dir + 0xff8);
                      bVar6 = false;
                      if (lf_arrayp._4_4_ == -1) {
                        piVar5 = __errno_location();
                        bVar6 = *piVar5 == 4;
                      }
                    } while (bVar6);
                    alarm(0);
                    if (lf_arrayp._4_4_ == -1) {
                      piVar5 = __errno_location();
                      *Lisp_errno = *piVar5;
                      args_local._4_4_ = 0;
                    }
                    else {
                      alarm(TIMEOUT_TIME);
                      do {
                        piVar5 = __errno_location();
                        *piVar5 = 0;
                        lf_arrayp._4_4_ = unlink(vless + 0xff8);
                        bVar6 = false;
                        if (lf_arrayp._4_4_ == -1) {
                          piVar5 = __errno_location();
                          bVar6 = *piVar5 == 4;
                        }
                      } while (bVar6);
                      alarm(0);
                      if (lf_arrayp._4_4_ == -1) {
                        piVar5 = __errno_location();
                        *Lisp_errno = *piVar5;
                        args_local._4_4_ = 0;
                      }
                      else {
                        iVar1 = maintain_version(dir + 0xff8,0);
                        if (iVar1 == 0) {
                          args_local._4_4_ = 0;
                        }
                        else {
                          args_local._4_4_ = 0x4c;
                        }
                      }
                    }
                  }
                }
                else {
                  alarm(TIMEOUT_TIME);
                  do {
                    piVar5 = __errno_location();
                    *piVar5 = 0;
                    lf_arrayp._4_4_ = unlink(fbuf + 0xff8);
                    bVar6 = false;
                    if (lf_arrayp._4_4_ == -1) {
                      piVar5 = __errno_location();
                      bVar6 = *piVar5 == 4;
                    }
                  } while (bVar6);
                  alarm(0);
                  if (lf_arrayp._4_4_ == -1) {
                    piVar5 = __errno_location();
                    *Lisp_errno = *piVar5;
                    args_local._4_4_ = 0;
                  }
                  else {
                    args_local._4_4_ = 0x4c;
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      *Lisp_errno = 200;
      args_local._4_4_ = 0;
    }
  }
  else {
    *Lisp_errno = 100;
    args_local._4_4_ = 0;
  }
  return args_local._4_4_;
}

Assistant:

LispPTR DSK_deletefile(LispPTR *args)
{
  char file[MAXPATHLEN], fbuf[MAXPATHLEN], vless[MAXPATHLEN];
  char dir[MAXPATHLEN], ver[VERSIONLEN];
  int rval, fatp;
#ifdef DOS
  char drive[1], rawname[MAXNAMLEN];
  int extlen; /* len of extension, for making backup filename */
#endif        /* DOS */

  ERRSETJMP(NIL);
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[1]);

  LispStringLength(args[0], rval, fatp);
  /*
   * Because of the version number convention, Lisp pathname might
   * be shorter than UNIX one.  For THIN string, the difference
   * is 2 bytes, for FAT string, 4 bytes.  Add 1 byte for NULL
   * terminating character.
   */
  rval = fatp ? rval + 4 + 1 : rval + 2 + 1;
  if (rval > MAXPATHLEN) FileNameTooLong(NIL);

  LispStringToCString(args[0], fbuf, MAXPATHLEN);
#ifdef DOS
  separate_drive(fbuf, drive);
  unixpathname(fbuf, file, 1, 0, drive, &extlen, rawname);
#else
  unixpathname(fbuf, file, 1, 0);
#endif

  if (unpack_filename(file, dir, fbuf, ver, 1) == 0) return (NIL);
  if (get_version_array(dir, fbuf) == 0) return (NIL);

  if (NoFileP(VA.files))
    return (NIL); /*
                   * If the specified file is deleted from
                   * outside of Lisp during the last time
                   * Lisp recognize it and now, this case
                   * will occur.
                   */

  /*
   * Although the file should have been recognized with "oldest" mode in Lisp
   * code, we have to recognize it again to know the "real" accessible name
   * of it.
   */

  ConcNameAndVersion(fbuf, ver, file);
  if (get_oldest(dir, VA.files, file, fbuf) == 0) return (NIL);

  if (get_versionless(VA.files, vless, dir) == 0) {
    /*
     * There is no versionless file.  All we have to do is to simply
     * try to unlink the specified file.
     */
    TIMEOUT(rval = unlink(file));
    if (rval == -1) {
      *Lisp_errno = errno;
      return (NIL);
    }
    return (ATOM_T);
  }

  /*
   * If a versionless file exists, we have to check the link status of it,
   * because deleting a versionless file or a file to which a versionless
   * file is linked will destroy the consistency of the version status.
   */

  if (check_vless_link(vless, VA.files, fbuf, &rval) == 0) return (NIL);

  if (strcmp(file, vless) == 0 || strcmp(file, fbuf) == 0) {
    if (*fbuf != '\0') {
      /*
       * Both of the versionless file and the file to which the
       * versionless file is linked have to be unlinked.
       */
      TIMEOUT(rval = unlink(vless));
      if (rval == -1) {
        *Lisp_errno = errno;
        return (NIL);
      }
      TIMEOUT(rval = unlink(fbuf));
      if (rval == -1) {
        *Lisp_errno = errno;
        return (NIL);
      }
      /*
       * Finally, we have to maintain the version status.
       */
      if (maintain_version(vless, 0) == 0) return (NIL);
      return (ATOM_T);
    } else {
      /*
       * Although the versionfile is specified, it is not linked
       * to any file in VA.files.  We should not maintain the version
       * status after deleting the versionless file, because
       * we cannot say whether the versionless file is actually under
       * control of the Medley DSK file system or not.
       */
      TIMEOUT(rval = unlink(vless));
      if (rval == -1) {
        *Lisp_errno = errno;
        return (NIL);
      }
      return (ATOM_T);
    }
  } else {
    /*
     * Just unlink the specified file.
     */
    TIMEOUT(rval = unlink(file));
    if (rval == -1) {
      *Lisp_errno = errno;
      return (NIL);
    }
    return (ATOM_T);
  }
}